

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O3

void __thiscall MarrayTest::assignmentOperatorTest<false>(MarrayTest *this)

{
  int iVar1;
  pointer piVar2;
  undefined8 uVar3;
  MarrayTest *pMVar4;
  bool bVar5;
  reference piVar6;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var7;
  size_t sVar8;
  size_t sVar9;
  reference piVar10;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var11;
  logic_error *plVar12;
  runtime_error *prVar13;
  code *pcVar14;
  size_t sVar15;
  int iVar16;
  undefined *puVar17;
  bool bVar18;
  Marray<int,_std::allocator<unsigned_long>_> m;
  Marray<int,_std::allocator<unsigned_long>_> n;
  int scalar;
  int local_f4;
  unsigned_long *local_f0;
  Marray<int,_std::allocator<unsigned_long>_> local_e8;
  undefined1 local_a0 [16];
  size_t *local_90;
  size_t *psStack_88;
  size_t *local_80;
  size_t sStack_78;
  size_t local_70;
  CoordinateOrder local_68;
  bool local_64;
  int local_54;
  int *local_50;
  MarrayTest *local_48;
  unsigned_long *local_40;
  unsigned_long *local_38;
  
  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ = (pointer)0x0;
  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.shape_ = (size_t *)0x0;
  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.shapeStrides_ =
       (size_t *)0x0;
  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.strides_ = (size_t *)0x0
  ;
  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.dimension_ = 0;
  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ = 0;
  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.coordinateOrder_ =
       LastMajorOrder;
  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.isSimple_ = true;
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            (&local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            (&local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>);
  if (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.isSimple_ == false)
  {
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar13,"Assertion failed.");
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_a0._0_8_ = (pointer)0x0;
  local_90 = (size_t *)0x0;
  psStack_88 = (size_t *)0x0;
  local_80 = (size_t *)0x0;
  sStack_78 = 0;
  local_70 = 0;
  local_68 = LastMajorOrder;
  local_64 = true;
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a0);
  if (local_64 == false) {
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar13,"Assertion failed.");
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_a0,&local_e8);
  operator_delete((void *)local_a0._0_8_,local_70 << 2);
  operator_delete(local_90,sStack_78 * 0x18);
  operator_delete(local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.data_,
                  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ <<
                  2);
  operator_delete(local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.shape_,
                  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                  dimension_ * 0x18);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            (&local_e8,&this->scalar_,&andres::defaultOrder,(allocator_type *)local_a0);
  local_a0._0_8_ = (pointer)0x0;
  local_90 = (size_t *)0x0;
  psStack_88 = (size_t *)0x0;
  local_80 = (size_t *)0x0;
  sStack_78 = 0;
  local_70 = 0;
  local_68 = LastMajorOrder;
  local_64 = true;
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a0);
  if (local_64 == false) {
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar13,"Assertion failed.");
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_a0,&local_e8);
  if (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ == (pointer)0x0) {
    plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar12,"Assertion failed.");
  }
  else {
    if ((pointer)local_a0._0_8_ != (pointer)0x0) {
      if ((local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.dimension_ ==
           sStack_78) &&
         (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
          local_70)) {
        local_f4 = 0;
        piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
                 execute<int,int,false,std::allocator<unsigned_long>>
                           (&local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>,
                            &local_f4);
        iVar16 = *piVar6;
        local_f4 = 0;
        piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
                 execute<int,int,false,std::allocator<unsigned_long>>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a0,&local_f4);
        if (iVar16 == *piVar6) {
          operator_delete((void *)local_a0._0_8_,local_70 << 2);
          operator_delete(local_90,sStack_78 * 0x18);
          operator_delete(local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.data_,
                          local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                          size_ << 2);
          operator_delete(local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                          shape_,local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                 geometry_.dimension_ * 0x18);
          _Var7._M_current = (unsigned_long *)operator_new(8);
          *_Var7._M_current = 0x18;
          andres::Marray<int,std::allocator<unsigned_long>>::
          Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((Marray<int,std::allocator<unsigned_long>> *)&local_e8,_Var7,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )(_Var7._M_current + 1),&this->scalar_,&andres::defaultOrder,
                     (allocator_type *)local_a0);
          local_a0._0_8_ = (pointer)0x0;
          local_90 = (size_t *)0x0;
          psStack_88 = (size_t *)0x0;
          local_80 = (size_t *)0x0;
          sStack_78 = 0;
          local_70 = 0;
          local_68 = LastMajorOrder;
          local_64 = true;
          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a0);
          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a0);
          if (local_64 == false) {
            prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar13,"Assertion failed.");
            __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          andres::Marray<int,_std::allocator<unsigned_long>_>::operator=
                    ((Marray<int,_std::allocator<unsigned_long>_> *)local_a0,&local_e8);
          local_48 = this;
          if (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ !=
              local_70) {
LAB_001dffa2:
            plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar12,"test failed.");
            pcVar14 = std::logic_error::~logic_error;
            puVar17 = &std::logic_error::typeinfo;
            goto LAB_001e0365;
          }
          if (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ == (pointer)0x0)
          {
            plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar12,"Assertion failed.");
          }
          else {
            if ((pointer)local_a0._0_8_ != (pointer)0x0) {
              if (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                  dimension_ != sStack_78) goto LAB_001dffa2;
              iVar16 = 0;
              do {
                local_f4 = iVar16;
                piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
                         execute<int,int,false,std::allocator<unsigned_long>>
                                   (&local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>
                                    ,&local_f4);
                iVar1 = *piVar6;
                local_f4 = iVar16;
                piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
                         execute<int,int,false,std::allocator<unsigned_long>>
                                   ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a0,
                                    &local_f4);
                if (iVar1 != *piVar6) {
                  plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar12,"test failed.");
                  __cxa_throw(plVar12,&std::logic_error::typeinfo,std::logic_error::~logic_error);
                }
                iVar16 = iVar16 + 1;
              } while (iVar16 != 0x18);
              operator_delete((void *)local_a0._0_8_,local_70 << 2);
              operator_delete(local_90,sStack_78 * 0x18);
              operator_delete(local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.data_,
                              local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.size_ << 2);
              operator_delete(local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.shape_,
                              local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.dimension_ * 0x18);
              operator_delete(_Var7._M_current,8);
              _Var7._M_current = (unsigned_long *)operator_new(0x10);
              *_Var7._M_current = 6;
              _Var7._M_current[1] = 4;
              andres::Marray<int,std::allocator<unsigned_long>>::
              Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Marray<int,std::allocator<unsigned_long>> *)&local_e8,_Var7,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(_Var7._M_current + 2),&local_48->scalar_,&andres::defaultOrder,
                         (allocator_type *)local_a0);
              local_a0._0_8_ = (pointer)0x0;
              local_90 = (size_t *)0x0;
              psStack_88 = (size_t *)0x0;
              local_80 = (size_t *)0x0;
              sStack_78 = 0;
              local_70 = 0;
              local_68 = LastMajorOrder;
              local_64 = true;
              andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a0);
              andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a0);
              if (local_64 == false) {
                prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar13,"Assertion failed.");
                __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              andres::Marray<int,_std::allocator<unsigned_long>_>::operator=
                        ((Marray<int,_std::allocator<unsigned_long>_> *)local_a0,&local_e8);
              if (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ !=
                  local_70) {
LAB_001dffd1:
                plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar12,"test failed.");
                pcVar14 = std::logic_error::~logic_error;
                puVar17 = &std::logic_error::typeinfo;
                goto LAB_001e03e7;
              }
              if (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ ==
                  (pointer)0x0) {
                plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar12,"Assertion failed.");
              }
              else {
                if ((pointer)local_a0._0_8_ != (pointer)0x0) {
                  if (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      dimension_ != sStack_78) goto LAB_001dffd1;
                  sVar15 = 0;
                  do {
                    iVar16 = 0;
                    do {
                      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                                         ((View<int,false,std::allocator<unsigned_long>> *)&local_e8
                                          ,sVar15,iVar16);
                      iVar1 = *piVar6;
                      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                                         ((View<int,false,std::allocator<unsigned_long>> *)local_a0,
                                          sVar15,iVar16);
                      if (iVar1 != *piVar6) {
                        plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::logic_error::logic_error(plVar12,"test failed.");
                        __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                    std::logic_error::~logic_error);
                      }
                      iVar16 = iVar16 + 1;
                    } while (iVar16 != 4);
                    sVar15 = sVar15 + 1;
                  } while (sVar15 != 6);
                  operator_delete((void *)local_a0._0_8_,local_70 << 2);
                  operator_delete(local_90,sStack_78 * 0x18);
                  operator_delete(local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  data_,local_e8.
                                        super_View<int,_false,_std::allocator<unsigned_long>_>.
                                        geometry_.size_ << 2);
                  operator_delete(local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.shape_,
                                  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.dimension_ * 0x18);
                  operator_delete(_Var7._M_current,0x10);
                  local_50 = (int *)operator_new(0x18);
                  *(unsigned_long *)local_50 = 3;
                  *(unsigned_long *)((long)local_50 + 8) = 4;
                  *(unsigned_long *)((long)local_50 + 0x10) = 2;
                  andres::Marray<int,std::allocator<unsigned_long>>::
                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                            ((Marray<int,std::allocator<unsigned_long>> *)&local_e8,
                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )local_50,(unsigned_long *)((long)local_50 + 0x18),&local_48->scalar_,
                             &andres::defaultOrder,(allocator_type *)local_a0);
                  local_a0._0_8_ = (pointer)0x0;
                  local_90 = (size_t *)0x0;
                  psStack_88 = (size_t *)0x0;
                  local_80 = (size_t *)0x0;
                  sStack_78 = 0;
                  local_70 = 0;
                  local_68 = LastMajorOrder;
                  local_64 = true;
                  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a0);
                  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a0);
                  if (local_64 == false) {
                    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(prVar13,"Assertion failed.");
                    __cxa_throw(prVar13,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=
                            ((Marray<int,_std::allocator<unsigned_long>_> *)local_a0,&local_e8);
                  if (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      size_ != local_70) {
LAB_001e0000:
                    plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::logic_error::logic_error(plVar12,"test failed.");
                    pcVar14 = std::logic_error::~logic_error;
                    puVar17 = &std::logic_error::typeinfo;
                    goto LAB_001e0469;
                  }
                  if (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ ==
                      (pointer)0x0) {
                    plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error((runtime_error *)plVar12,"Assertion failed.");
                  }
                  else {
                    if ((pointer)local_a0._0_8_ != (pointer)0x0) {
                      if (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                          dimension_ != sStack_78) goto LAB_001e0000;
                      local_f0 = (unsigned_long *)0x0;
                      do {
                        sVar15 = 0;
                        do {
                          iVar16 = 0;
                          bVar5 = true;
                          do {
                            bVar18 = bVar5;
                            andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                      (&local_e8.
                                        super_View<int,_false,_std::allocator<unsigned_long>_>);
                            piVar2 = local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>
                                     .data_;
                            if ((local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                 data_ == (pointer)0x0) ||
                               (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                geometry_.dimension_ != 3)) {
                              plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error
                                        ((runtime_error *)plVar12,"Assertion failed.");
LAB_001dfc20:
                              pcVar14 = std::runtime_error::~runtime_error;
                              puVar17 = &std::runtime_error::typeinfo;
LAB_001dfc2e:
                              __cxa_throw(plVar12,puVar17,pcVar14);
                            }
                            sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                    strides(&local_e8.
                                             super_View<int,_false,_std::allocator<unsigned_long>_>,
                                            0);
                            sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                    elementAccessHelper<int>
                                              (&local_e8.
                                                super_View<int,_false,_std::allocator<unsigned_long>_>
                                               ,3,sVar15,iVar16);
                            iVar1 = piVar2[sVar8 * (long)local_f0 + sVar9];
                            andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a0)
                            ;
                            uVar3 = local_a0._0_8_;
                            if (((pointer)local_a0._0_8_ == (pointer)0x0) || (sStack_78 != 3)) {
                              plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error
                                        ((runtime_error *)plVar12,"Assertion failed.");
                              goto LAB_001dfc20;
                            }
                            sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                    strides((View<int,_false,_std::allocator<unsigned_long>_> *)
                                            local_a0,0);
                            sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                    elementAccessHelper<int>
                                              ((View<int,_false,_std::allocator<unsigned_long>_> *)
                                               local_a0,3,sVar15,iVar16);
                            if (iVar1 != *(int *)(uVar3 + (sVar8 * (long)local_f0 + sVar9) * 4)) {
                              plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::logic_error::logic_error(plVar12,"test failed.");
                              pcVar14 = std::logic_error::~logic_error;
                              puVar17 = &std::logic_error::typeinfo;
                              goto LAB_001dfc2e;
                            }
                            iVar16 = 1;
                            bVar5 = false;
                          } while (bVar18);
                          sVar15 = sVar15 + 1;
                        } while (sVar15 != 4);
                        local_f0 = (unsigned_long *)((long)local_f0 + 1);
                      } while (local_f0 != (unsigned_long *)0x3);
                      operator_delete((void *)local_a0._0_8_,local_70 << 2);
                      operator_delete(local_90,sStack_78 * 0x18);
                      operator_delete(local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.data_,
                                      local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.size_ << 2);
                      operator_delete(local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.shape_,
                                      local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.dimension_ * 0x18);
                      operator_delete(local_50,0x18);
                      local_a0._0_8_ = (pointer)0x0;
                      local_90 = (size_t *)0x0;
                      psStack_88 = (size_t *)0x0;
                      local_80 = (size_t *)0x0;
                      sStack_78 = 0;
                      local_70 = 0;
                      local_68 = LastMajorOrder;
                      local_64 = true;
                      andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a0);
                      local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ =
                           (pointer)0x0;
                      local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      shape_ = (size_t *)0x0;
                      local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      shapeStrides_ = (size_t *)0x0;
                      local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      strides_ = (size_t *)0x0;
                      local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      dimension_ = 0;
                      local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      size_ = 0;
                      local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      coordinateOrder_ = LastMajorOrder;
                      local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      isSimple_ = true;
                      andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                (&local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>);
                      pMVar4 = local_48;
                      andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                (&local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>);
                      if (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                          isSimple_ == false) {
                        prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error(prVar13,"Assertion failed.");
                        __cxa_throw(prVar13,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      andres::Marray<int,std::allocator<unsigned_long>>::operator=
                                ((Marray<int,std::allocator<unsigned_long>> *)&local_e8,
                                 (View<int,_false,_std::allocator<unsigned_long>_> *)local_a0);
                      operator_delete(local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.data_,
                                      local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.size_ << 2);
                      operator_delete(local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.shape_,
                                      local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.dimension_ * 0x18);
                      operator_delete(local_90,sStack_78 * 0x18);
                      local_a0._0_8_ = pMVar4;
                      local_90 = (size_t *)operator_new(0);
                      sStack_78 = 0;
                      local_70 = 1;
                      local_68 = LastMajorOrder;
                      local_64 = true;
                      psStack_88 = local_90;
                      local_80 = local_90;
                      andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a0);
                      local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ =
                           (pointer)0x0;
                      local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      shape_ = (size_t *)0x0;
                      local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      shapeStrides_ = (size_t *)0x0;
                      local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      strides_ = (size_t *)0x0;
                      local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      dimension_ = 0;
                      local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      size_ = 0;
                      local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      coordinateOrder_ = LastMajorOrder;
                      local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      isSimple_ = true;
                      andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                (&local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>);
                      andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                (&local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>);
                      if (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                          isSimple_ == false) {
                        prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error(prVar13,"Assertion failed.");
                        __cxa_throw(prVar13,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      andres::Marray<int,std::allocator<unsigned_long>>::operator=
                                ((Marray<int,std::allocator<unsigned_long>> *)&local_e8,
                                 (View<int,_false,_std::allocator<unsigned_long>_> *)local_a0);
                      if (local_70 !=
                          local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                          size_) goto LAB_001dff73;
                      if ((MarrayTest *)local_a0._0_8_ == (MarrayTest *)0x0) {
                        plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error
                                  ((runtime_error *)plVar12,"Assertion failed.");
                      }
                      else {
                        if (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ !=
                            (pointer)0x0) {
                          if (sStack_78 ==
                              local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.dimension_) {
                            local_f4 = 0;
                            piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
                                     execute<int,int,false,std::allocator<unsigned_long>>
                                               ((View<int,_false,_std::allocator<unsigned_long>_> *)
                                                local_a0,&local_f4);
                            iVar16 = *piVar6;
                            local_f4 = 0;
                            piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
                                     execute<int,int,false,std::allocator<unsigned_long>>
                                               (&local_e8.
                                                 super_View<int,_false,_std::allocator<unsigned_long>_>
                                                ,&local_f4);
                            if (iVar16 == *piVar6) {
                              operator_delete(local_e8.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                              operator_delete(local_e8.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .geometry_.shape_,
                                              local_e8.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .geometry_.dimension_ * 0x18);
                              operator_delete(local_90,sStack_78 * 0x18);
                              _Var7._M_current = (unsigned_long *)operator_new(8);
                              *_Var7._M_current = 0x18;
                              local_a0._0_8_ = pMVar4->data_;
                              local_50 = (int *)local_a0._0_8_;
                              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                        ((Geometry<std::allocator<unsigned_long>> *)(local_a0 + 8),
                                         _Var7,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                )(_Var7._M_current + 1),&andres::defaultOrder,
                                         &andres::defaultOrder,(allocator_type *)&local_e8);
                              andres::View<int,_false,_std::allocator<unsigned_long>_>::
                              testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                            local_a0);
                              local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.data_
                                   = (pointer)0x0;
                              local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.shape_ = (size_t *)0x0;
                              local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.shapeStrides_ = (size_t *)0x0;
                              local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.strides_ = (size_t *)0x0;
                              local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.dimension_ = 0;
                              local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.size_ = 0;
                              local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.coordinateOrder_ = LastMajorOrder;
                              local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.isSimple_ = true;
                              andres::View<int,_false,_std::allocator<unsigned_long>_>::
                              testInvariant(&local_e8.
                                             super_View<int,_false,_std::allocator<unsigned_long>_>)
                              ;
                              andres::View<int,_false,_std::allocator<unsigned_long>_>::
                              testInvariant(&local_e8.
                                             super_View<int,_false,_std::allocator<unsigned_long>_>)
                              ;
                              if (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.isSimple_ == false) {
                                prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error(prVar13,"Assertion failed.");
                                __cxa_throw(prVar13,&std::runtime_error::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                              andres::Marray<int,std::allocator<unsigned_long>>::operator=
                                        ((Marray<int,std::allocator<unsigned_long>> *)&local_e8,
                                         (View<int,_false,_std::allocator<unsigned_long>_> *)
                                         local_a0);
                              if (local_70 !=
                                  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.size_) {
LAB_001e008d:
                                plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::logic_error::logic_error(plVar12,"test failed.");
                                pcVar14 = std::logic_error::~logic_error;
                                puVar17 = &std::logic_error::typeinfo;
                                goto LAB_001e05ce;
                              }
                              if ((int *)local_a0._0_8_ == (int *)0x0) {
                                plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error
                                          ((runtime_error *)plVar12,"Assertion failed.");
                              }
                              else {
                                if (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                    data_ != (pointer)0x0) {
                                  if (sStack_78 !=
                                      local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.dimension_) goto LAB_001e008d;
                                  iVar16 = 0;
                                  do {
                                    local_f4 = iVar16;
                                    piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
                                             execute<int,int,false,std::allocator<unsigned_long>>
                                                       ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0,&local_f4);
                                    iVar1 = *piVar6;
                                    local_f4 = iVar16;
                                    piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
                                             execute<int,int,false,std::allocator<unsigned_long>>
                                                       (&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_f4);
                                    if (iVar1 != *piVar6) {
                                      plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::logic_error::logic_error(plVar12,"test failed.");
                                      __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                  std::logic_error::~logic_error);
                                    }
                                    iVar16 = iVar16 + 1;
                                  } while (iVar16 != 0x18);
                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                  operator_delete(local_90,sStack_78 * 0x18);
                                  operator_delete(_Var7._M_current,8);
                                  _Var7._M_current = (unsigned_long *)operator_new(0x10);
                                  *_Var7._M_current = 6;
                                  _Var7._M_current[1] = 4;
                                  local_a0._0_8_ = local_50;
                                  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                            ((Geometry<std::allocator<unsigned_long>> *)
                                             (local_a0 + 8),_Var7,
                                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                              )(_Var7._M_current + 2),&andres::defaultOrder,
                                             &andres::defaultOrder,(allocator_type *)&local_e8);
                                  andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                  testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                                local_a0);
                                  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  data_ = (pointer)0x0;
                                  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.shape_ = (size_t *)0x0;
                                  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.shapeStrides_ = (size_t *)0x0;
                                  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.strides_ = (size_t *)0x0;
                                  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.dimension_ = 0;
                                  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.size_ = 0;
                                  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.coordinateOrder_ = LastMajorOrder;
                                  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.isSimple_ = true;
                                  andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                  testInvariant(&local_e8.
                                                 super_View<int,_false,_std::allocator<unsigned_long>_>
                                               );
                                  andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                  testInvariant(&local_e8.
                                                 super_View<int,_false,_std::allocator<unsigned_long>_>
                                               );
                                  if (local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.isSimple_ == false) {
                                    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error(prVar13,"Assertion failed.");
                                    __cxa_throw(prVar13,&std::runtime_error::typeinfo,
                                                std::runtime_error::~runtime_error);
                                  }
                                  andres::Marray<int,std::allocator<unsigned_long>>::operator=
                                            ((Marray<int,std::allocator<unsigned_long>> *)&local_e8,
                                             (View<int,_false,_std::allocator<unsigned_long>_> *)
                                             local_a0);
                                  if (local_70 !=
                                      local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.size_) {
LAB_001e00bc:
                                    plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::logic_error::logic_error(plVar12,"test failed.");
                                    pcVar14 = std::logic_error::~logic_error;
                                    puVar17 = &std::logic_error::typeinfo;
                                    goto LAB_001e0650;
                                  }
                                  if ((int *)local_a0._0_8_ == (int *)0x0) {
                                    plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error
                                              ((runtime_error *)plVar12,"Assertion failed.");
                                  }
                                  else {
                                    if (local_e8.
                                        super_View<int,_false,_std::allocator<unsigned_long>_>.data_
                                        != (pointer)0x0) {
                                      if (sStack_78 !=
                                          local_e8.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.dimension_) goto LAB_001e00bc;
                                      sVar15 = 0;
                                      do {
                                        iVar16 = 0;
                                        do {
                                          piVar6 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  local_a0,sVar15,iVar16);
                                          iVar1 = *piVar6;
                                          piVar6 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  &local_e8,sVar15,iVar16);
                                          if (iVar1 != *piVar6) {
                                            plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::logic_error::logic_error(plVar12,"test failed.");
                                            __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                        std::logic_error::~logic_error);
                                          }
                                          iVar16 = iVar16 + 1;
                                        } while (iVar16 != 4);
                                        sVar15 = sVar15 + 1;
                                      } while (sVar15 != 6);
                                      operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                      operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                      operator_delete(local_90,sStack_78 * 0x18);
                                      operator_delete(_Var7._M_current,0x10);
                                      local_40 = (unsigned_long *)operator_new(0x18);
                                      *local_40 = 3;
                                      local_40[1] = 4;
                                      local_40[2] = 2;
                                      local_a0._0_8_ = local_50;
                                      andres::marray_detail::Geometry<std::allocator<unsigned_long>>
                                      ::
                                      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                ((Geometry<std::allocator<unsigned_long>> *)
                                                 (local_a0 + 8),
                                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )local_40,
                                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_40 + 3),&andres::defaultOrder,
                                                 &andres::defaultOrder,(allocator_type *)&local_e8);
                                      andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                      testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0);
                                      local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.data_ =
                                           (pointer)0x0;
                                      local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.shape_ = (size_t *)0x0;
                                      local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.shapeStrides_ = (size_t *)0x0;
                                      local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.strides_ = (size_t *)0x0;
                                      local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.dimension_ = 0;
                                      local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.size_ = 0;
                                      local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.coordinateOrder_ = LastMajorOrder;
                                      local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.isSimple_ = true;
                                      andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                      testInvariant(&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                      andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                      testInvariant(&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                      if (local_e8.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.isSimple_ == false) {
                                        prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error
                                                  (prVar13,"Assertion failed.");
                                        __cxa_throw(prVar13,&std::runtime_error::typeinfo,
                                                    std::runtime_error::~runtime_error);
                                      }
                                      andres::Marray<int,std::allocator<unsigned_long>>::operator=
                                                ((Marray<int,std::allocator<unsigned_long>> *)
                                                 &local_e8,
                                                 (View<int,_false,_std::allocator<unsigned_long>_> *
                                                 )local_a0);
                                      if (local_70 !=
                                          local_e8.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.size_) {
LAB_001e00eb:
                                        plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::logic_error::logic_error(plVar12,"test failed.");
                                        pcVar14 = std::logic_error::~logic_error;
                                        puVar17 = &std::logic_error::typeinfo;
                                        goto LAB_001e06d2;
                                      }
                                      if ((int *)local_a0._0_8_ == (int *)0x0) {
                                        plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error
                                                  ((runtime_error *)plVar12,"Assertion failed.");
                                      }
                                      else {
                                        if (local_e8.
                                            super_View<int,_false,_std::allocator<unsigned_long>_>.
                                            data_ != (pointer)0x0) {
                                          if (sStack_78 !=
                                              local_e8.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .geometry_.dimension_) goto LAB_001e00eb;
                                          local_f0 = (unsigned_long *)0x0;
                                          do {
                                            sVar15 = 0;
                                            do {
                                              iVar16 = 0;
                                              bVar5 = true;
                                              do {
                                                bVar18 = bVar5;
                                                andres::
                                                View<int,_false,_std::allocator<unsigned_long>_>::
                                                testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0);
                                                uVar3 = local_a0._0_8_;
                                                if (((int *)local_a0._0_8_ == (int *)0x0) ||
                                                   (sStack_78 != 3)) {
                                                  plVar12 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar12,
                                                             "Assertion failed.");
LAB_001dfc9c:
                                                  pcVar14 = std::runtime_error::~runtime_error;
                                                  puVar17 = &std::runtime_error::typeinfo;
LAB_001dfcaa:
                                                  __cxa_throw(plVar12,puVar17,pcVar14);
                                                }
                                                sVar8 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0,0);
                                                sVar9 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0,3,sVar15,iVar16);
                                                iVar1 = *(int *)(uVar3 + (sVar8 * (long)local_f0 +
                                                                         sVar9) * 4);
                                                andres::
                                                View<int,_false,_std::allocator<unsigned_long>_>::
                                                testInvariant(&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                piVar2 = local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_;
                                                if ((local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) ||
                                                  (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ != 3)) {
                                                  plVar12 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar12,
                                                             "Assertion failed.");
                                                  goto LAB_001dfc9c;
                                                }
                                                sVar8 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                sVar9 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            (&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,3,sVar15,iVar16);
                                                if (iVar1 != piVar2[sVar8 * (long)local_f0 + sVar9])
                                                {
                                                  plVar12 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar12,"test failed.");
                                                  pcVar14 = std::logic_error::~logic_error;
                                                  puVar17 = &std::logic_error::typeinfo;
                                                  goto LAB_001dfcaa;
                                                }
                                                iVar16 = 1;
                                                bVar5 = false;
                                              } while (bVar18);
                                              sVar15 = sVar15 + 1;
                                            } while (sVar15 != 4);
                                            local_f0 = (unsigned_long *)((long)local_f0 + 1);
                                          } while (local_f0 != (unsigned_long *)0x3);
                                          operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                          operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                          operator_delete(local_90,sStack_78 * 0x18);
                                          operator_delete(local_40,0x18);
                                          local_e8.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          data_ = (pointer)0x0;
                                          local_e8.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.shape_ = (size_t *)0x0;
                                          local_e8.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.shapeStrides_ = (size_t *)0x0;
                                          local_e8.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.strides_ = (size_t *)0x0;
                                          local_e8.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.dimension_ = 0;
                                          local_e8.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.size_ = 0;
                                          local_e8.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.coordinateOrder_ = LastMajorOrder;
                                          local_e8.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.isSimple_ = true;
                                          andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                          testInvariant(&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                          andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                          testInvariant(&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                          pMVar4 = local_48;
                                          if (local_e8.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .geometry_.isSimple_ == false) {
                                            prVar13 = (runtime_error *)
                                                      __cxa_allocate_exception(0x10);
                                            std::runtime_error::runtime_error
                                                      (prVar13,"Assertion failed.");
                                            __cxa_throw(prVar13,&std::runtime_error::typeinfo,
                                                        std::runtime_error::~runtime_error);
                                          }
                                          andres::Marray<int,_std::allocator<unsigned_long>_>::
                                          Marray((Marray<int,_std::allocator<unsigned_long>_> *)
                                                 local_a0,&local_48->scalar_,&andres::defaultOrder,
                                                 (allocator_type *)&local_f4);
                                          andres::Marray<int,_std::allocator<unsigned_long>_>::
                                          operator=((Marray<int,_std::allocator<unsigned_long>_> *)
                                                    local_a0,&local_e8);
                                          operator_delete((void *)local_a0._0_8_,local_70 << 2);
                                          operator_delete(local_90,sStack_78 * 0x18);
                                          operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                          operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                          local_54 = 2;
                                          andres::Marray<int,_std::allocator<unsigned_long>_>::
                                          Marray(&local_e8,&local_54,&andres::defaultOrder,
                                                 (allocator_type *)local_a0);
                                          andres::Marray<int,_std::allocator<unsigned_long>_>::
                                          Marray((Marray<int,_std::allocator<unsigned_long>_> *)
                                                 local_a0,&pMVar4->scalar_,&andres::defaultOrder,
                                                 (allocator_type *)&local_f4);
                                          local_f4 = 0;
                                          piVar6 = andres::marray_detail::AccessOperatorHelper<true>
                                                   ::
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0,&local_f4);
                                          andres::Marray<int,_std::allocator<unsigned_long>_>::
                                          operator=((Marray<int,_std::allocator<unsigned_long>_> *)
                                                    local_a0,&local_e8);
                                          local_f4 = 0;
                                          piVar10 = andres::marray_detail::
                                                    AccessOperatorHelper<true>::
                                                                                                        
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0,&local_f4);
                                          if (piVar10 != piVar6) {
                                            plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::logic_error::logic_error(plVar12,"test failed.");
                                            __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                        std::logic_error::~logic_error);
                                          }
                                          if (local_e8.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .data_ == (pointer)0x0) {
                                            plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::runtime_error::runtime_error
                                                      ((runtime_error *)plVar12,"Assertion failed.")
                                            ;
                                          }
                                          else {
                                            if ((int *)local_a0._0_8_ != (int *)0x0) {
                                              if ((local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ == sStack_78) &&
                                                 (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ == local_70)) {
                                                local_f4 = 0;
                                                piVar6 = andres::marray_detail::
                                                         AccessOperatorHelper<true>::
                                                                                                                  
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_f4);
                                                iVar16 = *piVar6;
                                                local_f4 = 0;
                                                piVar6 = andres::marray_detail::
                                                         AccessOperatorHelper<true>::
                                                                                                                  
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0,&local_f4);
                                                if (iVar16 == *piVar6) {
                                                  operator_delete((void *)local_a0._0_8_,
                                                                  local_70 << 2);
                                                  operator_delete(local_90,sStack_78 * 0x18);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  local_a0._0_8_ = (pointer)0x0;
                                                  local_90 = (size_t *)0x0;
                                                  psStack_88 = (size_t *)0x0;
                                                  local_80 = (size_t *)0x0;
                                                  sStack_78 = 0;
                                                  local_70 = 0;
                                                  local_68 = LastMajorOrder;
                                                  local_64 = true;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0);
                                                  andres::
                                                  Marray<int,_std::allocator<unsigned_long>_>::
                                                  Marray(&local_e8,&pMVar4->scalar_,
                                                         &andres::defaultOrder,
                                                         (allocator_type *)&local_f4);
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::operator=((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,
                                                  (View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_a0);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_90,sStack_78 * 0x18);
                                                  local_a0._0_8_ = pMVar4;
                                                  local_90 = (size_t *)operator_new(0);
                                                  sStack_78 = 0;
                                                  local_70 = 1;
                                                  local_68 = LastMajorOrder;
                                                  local_64 = true;
                                                  psStack_88 = local_90;
                                                  local_80 = local_90;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0);
                                                  andres::
                                                  Marray<int,_std::allocator<unsigned_long>_>::
                                                  Marray(&local_e8,&pMVar4->scalar_,
                                                         &andres::defaultOrder,
                                                         (allocator_type *)&local_f4);
                                                  local_f4 = 0;
                                                  piVar6 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_f4);
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::operator=((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,
                                                  (View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_a0);
                                                  local_f4 = 0;
                                                  piVar10 = andres::marray_detail::
                                                            AccessOperatorHelper<true>::
                                                                                                                        
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_f4);
                                                  if (piVar10 != piVar6) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  if (local_70 !=
                                                      local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_) goto LAB_001e005e;
                                                  if ((MarrayTest *)local_a0._0_8_ ==
                                                      (MarrayTest *)0x0) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar12,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ != (pointer)0x0) {
                                                    if (sStack_78 ==
                                                        local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_) {
                                                    local_f4 = 0;
                                                    piVar6 = andres::marray_detail::
                                                             AccessOperatorHelper<true>::
                                                                                                                          
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0,&local_f4);
                                                  iVar16 = *piVar6;
                                                  local_f4 = 0;
                                                  piVar6 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_f4);
                                                  if (iVar16 == *piVar6) {
                                                    operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_90,sStack_78 * 0x18);
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ = (pointer)0x0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_ = (size_t *)0x0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shapeStrides_ = (size_t *)0x0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.strides_ = (size_t *)0x0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ = 0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ = 0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.coordinateOrder_ = LastMajorOrder;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.isSimple_ = true;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                  if (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.isSimple_ == false) {
                                                    prVar13 = (runtime_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              (prVar13,"Assertion failed.");
                                                    __cxa_throw(prVar13,&std::runtime_error::
                                                                         typeinfo,
                                                                std::runtime_error::~runtime_error);
                                                  }
                                                  _Var7._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var7._M_current = 0x18;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  local_a0,_Var7,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var7._M_current + 1),&pMVar4->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_f4)
                                                  ;
                                                  andres::
                                                  Marray<int,_std::allocator<unsigned_long>_>::
                                                  operator=((
                                                  Marray<int,_std::allocator<unsigned_long>_> *)
                                                  local_a0,&local_e8);
                                                  operator_delete((void *)local_a0._0_8_,
                                                                  local_70 << 2);
                                                  operator_delete(local_90,sStack_78 * 0x18);
                                                  operator_delete(_Var7._M_current,8);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  local_54 = 2;
                                                  local_f0 = (unsigned_long *)operator_new(8);
                                                  *local_f0 = 0x18;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )local_f0,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_f0 + 1),&local_54,&andres::defaultOrder,
                                                  (allocator_type *)local_a0);
                                                  _Var7._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var7._M_current = 0x18;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  local_a0,_Var7,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var7._M_current + 1),&pMVar4->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_f4)
                                                  ;
                                                  local_f4 = 0;
                                                  piVar6 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0,&local_f4);
                                                  andres::
                                                  Marray<int,_std::allocator<unsigned_long>_>::
                                                  operator=((
                                                  Marray<int,_std::allocator<unsigned_long>_> *)
                                                  local_a0,&local_e8);
                                                  local_f4 = 0;
                                                  piVar10 = andres::marray_detail::
                                                            AccessOperatorHelper<true>::
                                                                                                                        
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0,&local_f4);
                                                  if (piVar10 != piVar6) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  if (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ != local_70) {
LAB_001e011a:
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    pcVar14 = std::logic_error::~logic_error;
                                                    puVar17 = &std::logic_error::typeinfo;
                                                    goto LAB_001e08bc;
                                                  }
                                                  if (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar12,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if ((MarrayTest *)local_a0._0_8_ !=
                                                        (MarrayTest *)0x0) {
                                                      if (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ != sStack_78)
                                                  goto LAB_001e011a;
                                                  iVar16 = 0;
                                                  do {
                                                    local_f4 = iVar16;
                                                    piVar6 = andres::marray_detail::
                                                             AccessOperatorHelper<true>::
                                                                                                                          
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_f4);
                                                  iVar1 = *piVar6;
                                                  local_f4 = iVar16;
                                                  piVar6 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0,&local_f4);
                                                  if (iVar1 != *piVar6) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  iVar16 = iVar16 + 1;
                                                  } while (iVar16 != 0x18);
                                                  operator_delete((void *)local_a0._0_8_,
                                                                  local_70 << 2);
                                                  operator_delete(local_90,sStack_78 * 0x18);
                                                  operator_delete(_Var7._M_current,8);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_f0,8);
                                                  local_a0._0_8_ = (pointer)0x0;
                                                  local_90 = (size_t *)0x0;
                                                  psStack_88 = (size_t *)0x0;
                                                  local_80 = (size_t *)0x0;
                                                  sStack_78 = 0;
                                                  local_70 = 0;
                                                  local_68 = LastMajorOrder;
                                                  local_64 = true;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0);
                                                  _Var7._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  pMVar4 = local_48;
                                                  *_Var7._M_current = 0x18;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,_Var7,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var7._M_current + 1),&local_48->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_f4)
                                                  ;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::operator=((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,
                                                  (View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_a0);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(_Var7._M_current,8);
                                                  operator_delete(local_90,sStack_78 * 0x18);
                                                  local_f0 = (unsigned_long *)operator_new(8);
                                                  *local_f0 = 0x18;
                                                  local_a0._0_8_ = local_50;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_a0 + 8),
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )local_f0,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_f0 + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_e8)
                                                  ;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0);
                                                  _Var7._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var7._M_current = 0x18;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,_Var7,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var7._M_current + 1),&pMVar4->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_f4)
                                                  ;
                                                  local_f4 = 0;
                                                  piVar6 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_f4);
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::operator=((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,
                                                  (View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_a0);
                                                  local_f4 = 0;
                                                  piVar10 = andres::marray_detail::
                                                            AccessOperatorHelper<true>::
                                                                                                                        
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_f4);
                                                  if (piVar10 != piVar6) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  if (local_70 !=
                                                      local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_) {
LAB_001e0149:
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    pcVar14 = std::logic_error::~logic_error;
                                                    puVar17 = &std::logic_error::typeinfo;
                                                    goto LAB_001e093e;
                                                  }
                                                  if ((int *)local_a0._0_8_ == (int *)0x0) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar12,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ != (pointer)0x0) {
                                                    if (sStack_78 !=
                                                        local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_) goto LAB_001e0149;
                                                  iVar16 = 0;
                                                  do {
                                                    local_f4 = iVar16;
                                                    piVar6 = andres::marray_detail::
                                                             AccessOperatorHelper<true>::
                                                                                                                          
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0,&local_f4);
                                                  iVar1 = *piVar6;
                                                  local_f4 = iVar16;
                                                  piVar6 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_f4);
                                                  if (iVar1 != *piVar6) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  iVar16 = iVar16 + 1;
                                                  } while (iVar16 != 0x18);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(_Var7._M_current,8);
                                                  operator_delete(local_90,sStack_78 * 0x18);
                                                  operator_delete(local_f0,8);
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ = (pointer)0x0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_ = (size_t *)0x0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shapeStrides_ = (size_t *)0x0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.strides_ = (size_t *)0x0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ = 0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ = 0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.coordinateOrder_ = LastMajorOrder;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.isSimple_ = true;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                  pMVar4 = local_48;
                                                  if (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.isSimple_ == false) {
                                                    prVar13 = (runtime_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              (prVar13,"Assertion failed.");
                                                    __cxa_throw(prVar13,&std::runtime_error::
                                                                         typeinfo,
                                                                std::runtime_error::~runtime_error);
                                                  }
                                                  _Var7._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var7._M_current = 4;
                                                  _Var7._M_current[1] = 6;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  local_a0,_Var7,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var7._M_current + 2),&pMVar4->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_f4)
                                                  ;
                                                  andres::
                                                  Marray<int,_std::allocator<unsigned_long>_>::
                                                  operator=((
                                                  Marray<int,_std::allocator<unsigned_long>_> *)
                                                  local_a0,&local_e8);
                                                  operator_delete((void *)local_a0._0_8_,
                                                                  local_70 << 2);
                                                  operator_delete(local_90,sStack_78 * 0x18);
                                                  operator_delete(_Var7._M_current,0x10);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  local_54 = 2;
                                                  _Var7._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var7._M_current = 6;
                                                  _Var7._M_current[1] = 4;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,_Var7,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var7._M_current + 2),&local_54,
                                                  &andres::defaultOrder,(allocator_type *)local_a0);
                                                  _Var11._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var11._M_current = 6;
                                                  _Var11._M_current[1] = 4;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  local_a0,_Var11,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var11._M_current + 2),&pMVar4->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_f4)
                                                  ;
                                                  local_f4 = 0;
                                                  piVar6 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0,&local_f4);
                                                  andres::
                                                  Marray<int,_std::allocator<unsigned_long>_>::
                                                  operator=((
                                                  Marray<int,_std::allocator<unsigned_long>_> *)
                                                  local_a0,&local_e8);
                                                  local_f4 = 0;
                                                  piVar10 = andres::marray_detail::
                                                            AccessOperatorHelper<true>::
                                                                                                                        
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0,&local_f4);
                                                  if (piVar10 != piVar6) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  if (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ != local_70) {
LAB_001e0178:
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    pcVar14 = std::logic_error::~logic_error;
                                                    puVar17 = &std::logic_error::typeinfo;
                                                    goto LAB_001e09f2;
                                                  }
                                                  if (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar12,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if ((int *)local_a0._0_8_ != (int *)0x0) {
                                                      if (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ != sStack_78)
                                                  goto LAB_001e0178;
                                                  sVar15 = 0;
                                                  local_f0 = _Var7._M_current;
                                                  do {
                                                    iVar16 = 0;
                                                    do {
                                                      piVar6 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  &local_e8,sVar15,iVar16);
                                                  iVar1 = *piVar6;
                                                  piVar6 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  local_a0,sVar15,iVar16);
                                                  if (iVar1 != *piVar6) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  iVar16 = iVar16 + 1;
                                                  } while (iVar16 != 4);
                                                  sVar15 = sVar15 + 1;
                                                  } while (sVar15 != 6);
                                                  operator_delete((void *)local_a0._0_8_,
                                                                  local_70 << 2);
                                                  operator_delete(local_90,sStack_78 * 0x18);
                                                  operator_delete(_Var11._M_current,0x10);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_f0,0x10);
                                                  local_a0._0_8_ = (pointer)0x0;
                                                  local_90 = (size_t *)0x0;
                                                  psStack_88 = (size_t *)0x0;
                                                  local_80 = (size_t *)0x0;
                                                  sStack_78 = 0;
                                                  local_70 = 0;
                                                  local_68 = LastMajorOrder;
                                                  local_64 = true;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0);
                                                  _Var7._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  pMVar4 = local_48;
                                                  *_Var7._M_current = 4;
                                                  _Var7._M_current[1] = 6;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,_Var7,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var7._M_current + 2),&local_48->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_f4)
                                                  ;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::operator=((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,
                                                  (View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_a0);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(_Var7._M_current,0x10);
                                                  operator_delete(local_90,sStack_78 * 0x18);
                                                  _Var7._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var7._M_current = 6;
                                                  _Var7._M_current[1] = 4;
                                                  local_a0._0_8_ = local_50;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_a0 + 8),_Var7,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var7._M_current + 2),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_e8)
                                                  ;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0);
                                                  _Var11._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var11._M_current = 6;
                                                  _Var11._M_current[1] = 4;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,_Var11,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var11._M_current + 2),&pMVar4->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_f4)
                                                  ;
                                                  local_f4 = 0;
                                                  piVar6 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_f4);
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::operator=((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,
                                                  (View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_a0);
                                                  local_f4 = 0;
                                                  piVar10 = andres::marray_detail::
                                                            AccessOperatorHelper<true>::
                                                                                                                        
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_f4);
                                                  if (piVar10 != piVar6) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  if (local_70 !=
                                                      local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_) {
LAB_001e01a7:
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    pcVar14 = std::logic_error::~logic_error;
                                                    puVar17 = &std::logic_error::typeinfo;
                                                    goto LAB_001e0a74;
                                                  }
                                                  if ((int *)local_a0._0_8_ == (int *)0x0) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar12,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ != (pointer)0x0) {
                                                    if (sStack_78 !=
                                                        local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_) goto LAB_001e01a7;
                                                  sVar15 = 0;
                                                  local_f0 = _Var7._M_current;
                                                  do {
                                                    iVar16 = 0;
                                                    do {
                                                      piVar6 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  local_a0,sVar15,iVar16);
                                                  iVar1 = *piVar6;
                                                  piVar6 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  &local_e8,sVar15,iVar16);
                                                  if (iVar1 != *piVar6) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  iVar16 = iVar16 + 1;
                                                  } while (iVar16 != 4);
                                                  sVar15 = sVar15 + 1;
                                                  } while (sVar15 != 6);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(_Var11._M_current,0x10);
                                                  operator_delete(local_90,sStack_78 * 0x18);
                                                  operator_delete(local_f0,0x10);
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ = (pointer)0x0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_ = (size_t *)0x0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shapeStrides_ = (size_t *)0x0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.strides_ = (size_t *)0x0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ = 0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ = 0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.coordinateOrder_ = LastMajorOrder;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.isSimple_ = true;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                  pMVar4 = local_48;
                                                  if (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.isSimple_ == false) {
                                                    prVar13 = (runtime_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              (prVar13,"Assertion failed.");
                                                    __cxa_throw(prVar13,&std::runtime_error::
                                                                         typeinfo,
                                                                std::runtime_error::~runtime_error);
                                                  }
                                                  _Var7._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var7._M_current = 2;
                                                  _Var7._M_current[1] = 3;
                                                  _Var7._M_current[2] = 4;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  local_a0,_Var7,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var7._M_current + 3),&pMVar4->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_f4)
                                                  ;
                                                  andres::
                                                  Marray<int,_std::allocator<unsigned_long>_>::
                                                  operator=((
                                                  Marray<int,_std::allocator<unsigned_long>_> *)
                                                  local_a0,&local_e8);
                                                  operator_delete((void *)local_a0._0_8_,
                                                                  local_70 << 2);
                                                  operator_delete(local_90,sStack_78 * 0x18);
                                                  operator_delete(_Var7._M_current,0x18);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  local_54 = 2;
                                                  local_40 = (unsigned_long *)operator_new(0x18);
                                                  *local_40 = 3;
                                                  local_40[1] = 4;
                                                  local_40[2] = 2;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )local_40,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_40 + 3),&local_54,&andres::defaultOrder,
                                                  (allocator_type *)local_a0);
                                                  local_38 = (unsigned_long *)operator_new(0x18);
                                                  *local_38 = 3;
                                                  local_38[1] = 4;
                                                  local_38[2] = 2;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  local_a0,(
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )local_38,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_38 + 3),&pMVar4->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_f4)
                                                  ;
                                                  local_f4 = 0;
                                                  piVar6 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0,&local_f4);
                                                  andres::
                                                  Marray<int,_std::allocator<unsigned_long>_>::
                                                  operator=((
                                                  Marray<int,_std::allocator<unsigned_long>_> *)
                                                  local_a0,&local_e8);
                                                  local_f4 = 0;
                                                  piVar10 = andres::marray_detail::
                                                            AccessOperatorHelper<true>::
                                                                                                                        
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0,&local_f4);
                                                  if (piVar10 != piVar6) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  if (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ != local_70) {
LAB_001e01d6:
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    pcVar14 = std::logic_error::~logic_error;
                                                    puVar17 = &std::logic_error::typeinfo;
                                                    goto LAB_001e0b28;
                                                  }
                                                  if (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar12,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if ((int *)local_a0._0_8_ != (int *)0x0) {
                                                      if (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ != sStack_78)
                                                  goto LAB_001e01d6;
                                                  local_f0 = (unsigned_long *)0x0;
                                                  do {
                                                    sVar15 = 0;
                                                    do {
                                                      iVar16 = 0;
                                                      bVar5 = true;
                                                      do {
                                                        bVar18 = bVar5;
                                                        andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                  piVar2 = local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_;
                                                  if ((local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) ||
                                                  (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ != 3)) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar12,
                                                               "Assertion failed.");
LAB_001dfd18:
                                                    pcVar14 = std::runtime_error::~runtime_error;
                                                    puVar17 = &std::runtime_error::typeinfo;
LAB_001dfd26:
                                                    __cxa_throw(plVar12,puVar17,pcVar14);
                                                  }
                                                  sVar8 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                  sVar9 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            (&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,3,sVar15,iVar16);
                                                  iVar1 = piVar2[sVar8 * (long)local_f0 + sVar9];
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0);
                                                  uVar3 = local_a0._0_8_;
                                                  if (((int *)local_a0._0_8_ == (int *)0x0) ||
                                                     (sStack_78 != 3)) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar12,
                                                               "Assertion failed.");
                                                    goto LAB_001dfd18;
                                                  }
                                                  sVar8 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0,0);
                                                  sVar9 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0,3,sVar15,iVar16);
                                                  if (iVar1 != *(int *)(uVar3 + (sVar8 * (long)
                                                  local_f0 + sVar9) * 4)) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    pcVar14 = std::logic_error::~logic_error;
                                                    puVar17 = &std::logic_error::typeinfo;
                                                    goto LAB_001dfd26;
                                                  }
                                                  iVar16 = 1;
                                                  bVar5 = false;
                                                  } while (bVar18);
                                                  sVar15 = sVar15 + 1;
                                                  } while (sVar15 != 4);
                                                  local_f0 = (unsigned_long *)((long)local_f0 + 1);
                                                  } while (local_f0 != (unsigned_long *)0x3);
                                                  operator_delete((void *)local_a0._0_8_,
                                                                  local_70 << 2);
                                                  operator_delete(local_90,sStack_78 * 0x18);
                                                  operator_delete(local_38,0x18);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_40,0x18);
                                                  local_a0._0_8_ = (pointer)0x0;
                                                  local_90 = (size_t *)0x0;
                                                  psStack_88 = (size_t *)0x0;
                                                  local_80 = (size_t *)0x0;
                                                  sStack_78 = 0;
                                                  local_70 = 0;
                                                  local_68 = LastMajorOrder;
                                                  local_64 = true;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0);
                                                  _Var7._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  pMVar4 = local_48;
                                                  *_Var7._M_current = 2;
                                                  _Var7._M_current[1] = 3;
                                                  _Var7._M_current[2] = 4;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,_Var7,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var7._M_current + 3),&local_48->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_f4)
                                                  ;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::operator=((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,
                                                  (View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_a0);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(_Var7._M_current,0x18);
                                                  operator_delete(local_90,sStack_78 * 0x18);
                                                  _Var7._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var7._M_current = 3;
                                                  _Var7._M_current[1] = 4;
                                                  _Var7._M_current[2] = 2;
                                                  local_a0._0_8_ = local_50;
                                                  local_50 = (int *)_Var7._M_current;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_a0 + 8),_Var7,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var7._M_current + 3),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_e8)
                                                  ;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0);
                                                  local_40 = (unsigned_long *)operator_new(0x18);
                                                  *local_40 = 3;
                                                  local_40[1] = 4;
                                                  local_40[2] = 2;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )local_40,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_40 + 3),&pMVar4->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_f4)
                                                  ;
                                                  local_f4 = 0;
                                                  piVar6 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_f4);
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::operator=((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,
                                                  (View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_a0);
                                                  local_f4 = 0;
                                                  piVar10 = andres::marray_detail::
                                                            AccessOperatorHelper<true>::
                                                                                                                        
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_f4);
                                                  if (piVar10 != piVar6) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  if (local_70 ==
                                                      local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_) {
                                                    if ((int *)local_a0._0_8_ == (int *)0x0) {
                                                      plVar12 = (logic_error *)
                                                                __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar12,
                                                                 "Assertion failed.");
                                                    }
                                                    else {
                                                      if (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ != (pointer)0x0) {
                                                    if (sStack_78 ==
                                                        local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_) {
                                                    local_f0 = (unsigned_long *)0x0;
                                                    do {
                                                      sVar15 = 0;
                                                      do {
                                                        iVar16 = 0;
                                                        bVar5 = true;
                                                        do {
                                                          bVar18 = bVar5;
                                                          andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0);
                                                  uVar3 = local_a0._0_8_;
                                                  if (((int *)local_a0._0_8_ == (int *)0x0) ||
                                                     (sStack_78 != 3)) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar12,
                                                               "Assertion failed.");
LAB_001dfd94:
                                                    pcVar14 = std::runtime_error::~runtime_error;
                                                    puVar17 = &std::runtime_error::typeinfo;
LAB_001dfda2:
                                                    __cxa_throw(plVar12,puVar17,pcVar14);
                                                  }
                                                  sVar8 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0,0);
                                                  sVar9 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0,3,sVar15,iVar16);
                                                  iVar1 = *(int *)(uVar3 + (sVar8 * (long)local_f0 +
                                                                           sVar9) * 4);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                  piVar2 = local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_;
                                                  if ((local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) ||
                                                  (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ != 3)) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar12,
                                                               "Assertion failed.");
                                                    goto LAB_001dfd94;
                                                  }
                                                  sVar8 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                  sVar9 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            (&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,3,sVar15,iVar16);
                                                  if (iVar1 != piVar2[sVar8 * (long)local_f0 + sVar9
                                                                     ]) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    pcVar14 = std::logic_error::~logic_error;
                                                    puVar17 = &std::logic_error::typeinfo;
                                                    goto LAB_001dfda2;
                                                  }
                                                  iVar16 = 1;
                                                  bVar5 = false;
                                                  } while (bVar18);
                                                  sVar15 = sVar15 + 1;
                                                  } while (sVar15 != 4);
                                                  local_f0 = (unsigned_long *)((long)local_f0 + 1);
                                                  if (local_f0 == (unsigned_long *)0x3) {
                                                    operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_40,0x18);
                                                  operator_delete(local_90,sStack_78 * 0x18);
                                                  operator_delete(local_50,0x18);
                                                  return;
                                                  }
                                                  } while( true );
                                                  }
                                                  goto LAB_001e0471;
                                                  }
                                                  plVar12 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar12,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar14 = std::runtime_error::~runtime_error;
                                                  puVar17 = &std::runtime_error::typeinfo;
                                                  }
                                                  else {
LAB_001e0471:
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    pcVar14 = std::logic_error::~logic_error;
                                                    puVar17 = &std::logic_error::typeinfo;
                                                  }
                                                  __cxa_throw(plVar12,puVar17,pcVar14);
                                                  }
                                                  plVar12 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar12,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar14 = std::runtime_error::~runtime_error;
                                                  puVar17 = &std::runtime_error::typeinfo;
LAB_001e0b28:
                                                  __cxa_throw(plVar12,puVar17,pcVar14);
                                                  }
                                                  plVar12 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar12,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar14 = std::runtime_error::~runtime_error;
                                                  puVar17 = &std::runtime_error::typeinfo;
LAB_001e0a74:
                                                  __cxa_throw(plVar12,puVar17,pcVar14);
                                                  }
                                                  plVar12 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar12,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar14 = std::runtime_error::~runtime_error;
                                                  puVar17 = &std::runtime_error::typeinfo;
LAB_001e09f2:
                                                  __cxa_throw(plVar12,puVar17,pcVar14);
                                                  }
                                                  plVar12 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar12,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar14 = std::runtime_error::~runtime_error;
                                                  puVar17 = &std::runtime_error::typeinfo;
LAB_001e093e:
                                                  __cxa_throw(plVar12,puVar17,pcVar14);
                                                  }
                                                  plVar12 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar12,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar14 = std::runtime_error::~runtime_error;
                                                  puVar17 = &std::runtime_error::typeinfo;
LAB_001e08bc:
                                                  __cxa_throw(plVar12,puVar17,pcVar14);
                                                  }
                                                  }
LAB_001e005e:
                                                  plVar12 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar12,"test failed.");
                                                  pcVar14 = std::logic_error::~logic_error;
                                                  puVar17 = &std::logic_error::typeinfo;
                                                  goto LAB_001e0808;
                                                  }
                                                  plVar12 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar12,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar14 = std::runtime_error::~runtime_error;
                                                  puVar17 = &std::runtime_error::typeinfo;
LAB_001e0808:
                                                  __cxa_throw(plVar12,puVar17,pcVar14);
                                                }
                                              }
                                              plVar12 = (logic_error *)
                                                        __cxa_allocate_exception(0x10);
                                              std::logic_error::logic_error(plVar12,"test failed.");
                                              pcVar14 = std::logic_error::~logic_error;
                                              puVar17 = &std::logic_error::typeinfo;
                                              goto LAB_001e0786;
                                            }
                                            plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::runtime_error::runtime_error
                                                      ((runtime_error *)plVar12,"Assertion failed.")
                                            ;
                                          }
                                          pcVar14 = std::runtime_error::~runtime_error;
                                          puVar17 = &std::runtime_error::typeinfo;
LAB_001e0786:
                                          __cxa_throw(plVar12,puVar17,pcVar14);
                                        }
                                        plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error
                                                  ((runtime_error *)plVar12,"Assertion failed.");
                                      }
                                      pcVar14 = std::runtime_error::~runtime_error;
                                      puVar17 = &std::runtime_error::typeinfo;
LAB_001e06d2:
                                      __cxa_throw(plVar12,puVar17,pcVar14);
                                    }
                                    plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error
                                              ((runtime_error *)plVar12,"Assertion failed.");
                                  }
                                  pcVar14 = std::runtime_error::~runtime_error;
                                  puVar17 = &std::runtime_error::typeinfo;
LAB_001e0650:
                                  __cxa_throw(plVar12,puVar17,pcVar14);
                                }
                                plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error
                                          ((runtime_error *)plVar12,"Assertion failed.");
                              }
                              pcVar14 = std::runtime_error::~runtime_error;
                              puVar17 = &std::runtime_error::typeinfo;
LAB_001e05ce:
                              __cxa_throw(plVar12,puVar17,pcVar14);
                            }
                          }
LAB_001dff73:
                          plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                          std::logic_error::logic_error(plVar12,"test failed.");
                          pcVar14 = std::logic_error::~logic_error;
                          puVar17 = &std::logic_error::typeinfo;
                          goto LAB_001e054c;
                        }
                        plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error
                                  ((runtime_error *)plVar12,"Assertion failed.");
                      }
                      pcVar14 = std::runtime_error::~runtime_error;
                      puVar17 = &std::runtime_error::typeinfo;
LAB_001e054c:
                      __cxa_throw(plVar12,puVar17,pcVar14);
                    }
                    plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error((runtime_error *)plVar12,"Assertion failed.");
                  }
                  pcVar14 = std::runtime_error::~runtime_error;
                  puVar17 = &std::runtime_error::typeinfo;
LAB_001e0469:
                  __cxa_throw(plVar12,puVar17,pcVar14);
                }
                plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar12,"Assertion failed.");
              }
              pcVar14 = std::runtime_error::~runtime_error;
              puVar17 = &std::runtime_error::typeinfo;
LAB_001e03e7:
              __cxa_throw(plVar12,puVar17,pcVar14);
            }
            plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar12,"Assertion failed.");
          }
          pcVar14 = std::runtime_error::~runtime_error;
          puVar17 = &std::runtime_error::typeinfo;
LAB_001e0365:
          __cxa_throw(plVar12,puVar17,pcVar14);
        }
      }
      plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar12,"test failed.");
      pcVar14 = std::logic_error::~logic_error;
      puVar17 = &std::logic_error::typeinfo;
      goto LAB_001e02e3;
    }
    plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar12,"Assertion failed.");
  }
  pcVar14 = std::runtime_error::~runtime_error;
  puVar17 = &std::runtime_error::typeinfo;
LAB_001e02e3:
  __cxa_throw(plVar12,puVar17,pcVar14);
}

Assistant:

void MarrayTest::assignmentOperatorTest(){
    // empty
    {
        // from a Marray
        {
            // empty
            {
                andres::Marray<int> m;
                andres::Marray<int> n;
                n = m;
            }
            // scalar
            {
                andres::Marray<int> m(scalar_);
                andres::Marray<int> n;
                n = m;

                test(m.dimension() == n.dimension() &&
                       m.size() == n.size() &&
                       m(0) == n(0));
            }
            // 1D
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::Marray<int> m(shape.begin(), shape.end(), scalar_);
                andres::Marray<int> n;
                n = m;

                test(m.size()==n.size() && m.dimension()==n.dimension()
                );
                for(int x = 0; x < 24; ++x)
                    test(m(x)==n(x));
            }
            // 2D
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6; 
                shape[1] = 4;
                andres::Marray<int> m(shape.begin(), shape.end(), scalar_);

                andres::Marray<int> n;
                n = m;

                test(m.size()==n.size() && m.dimension()==n.dimension()
                );
                for(int x = 0; x < 6; ++x){
                    for(int y = 0; y < 4; ++y)
                        test(m(x, y)==n(x, y));
                }
            }
            // 3D 
            {
                std::vector<std::size_t> shape(3); 
                shape[0] = 3;
                shape[1] = 4; 
                shape[2] = 2; 
                andres::Marray<int> m(shape.begin(), shape.end(), scalar_);
                andres::Marray<int> n;
                n = m;

                test(m.size()==n.size() && m.dimension()==n.dimension()
                );
                for(int x = 0; x < 3; ++x){
                    for(int y = 0; y < 4; ++y){
                        for(int z = 0; z < 2; ++z)
                            test(m(x, y, z)==n(x, y, z));
                    }
                }
            }
        }
        // from a view
        {
            // empty
            {
                andres::View<int, constTarget> v;
                andres::Marray<int> m;
                m = v;
            }
            // scalar
            {
                andres::View<int, constTarget> v(&scalar_);
                andres::Marray<int> m;
                m = v;

                test(v.size()==m.size() &&
                       v.dimension()==m.dimension() &&
                       v(0)==m(0));
            }
            // 1D
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Marray<int> m;
                m = v;
                
                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int i = 0; i < 24; ++i)
                    test(v(i)==m(i));
            }
            // 2D
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6; 
                shape[1] = 4;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Marray<int> m;
                m = v;

                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int x = 0; x < 6; ++x){
                    for(int y = 0; y < 4; ++y)
                        test(v(x, y)==m(x, y));
                }
            }
            // 3D
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4; 
                shape[2] = 2; 
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Marray<int> m;
                m = v;

                test(v.size()==m.size() &&
                       v.dimension()==m.dimension());
                for(int x = 0; x < 3; ++x){
                    for(int y = 0; y < 4; ++y){
                        for(int z = 0; z < 2; ++z)
                            test(v(x, y, z)==m(x, y, z));
                    }
                }
            }
        }
    }
    // scalar
    {
        // from a Marray
        {
            // empty
            {
                andres::Marray<int> m;
                andres::Marray<int> n(scalar_);
                n = m;
            }
            // scalar
            {
                int scalar = 2;
                andres::Marray<int> m(scalar);
                andres::Marray<int> n(scalar_);
                int* n_address = &n(0);
                n = m;
                
                test(&n(0) == n_address);
                test(m.dimension() == n.dimension() &&
                       m.size() == n.size() &&
                       m(0) == n(0));
            }
        }
        // from a view
        {
            // empty
            {
                andres::View<int, constTarget> v;
                andres::Marray<int> m(scalar_);
                m = v;
            }
            // scalar
            {
                andres::View<int, constTarget> v(&scalar_);
                andres::Marray<int> m(scalar_);
                int* m_address = &m(0);
                m = v;
                
                test(&m(0) == m_address);
                test(v.size()==m.size() &&
                       v.dimension()==m.dimension() &&
                       v(0)==m(0));
            }
        }
    }
    // 1D
    {
        // from a Marray
        {
            // empty
            {
                andres::Marray<int> m;
                std::vector<std::size_t> shapen(1);
                shapen[0] = 24;
                andres::Marray<int> n(shapen.begin(), shapen.end(), scalar_);
                n = m;
            }
            // 1D
            {
                int scalar = 2;
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::Marray<int> m(shape.begin(), shape.end(), scalar);
                std::vector<std::size_t> shapen(1);
                shapen[0] = 24;
                andres::Marray<int> n(shapen.begin(), shapen.end(), scalar_);
                int* n_address = &n(0);
                n = m;
                
                test(&n(0) == n_address
                );
                test(m.size()==n.size() && m.dimension()==n.dimension()
                );
                for(int x = 0; x < 24; ++x)
                    test(m(x)==n(x));
            }
        }
        // from a view
        {
            // empty
            {
                andres::View<int, constTarget> v;
                std::vector<std::size_t> shapem(1);
                shapem[0] = 24;
                andres::Marray<int> m(shapem.begin(), shapem.end(), scalar_);
                m = v;
            }
            // 1D
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                std::vector<std::size_t> shapem(1);
                shapem[0] = 24;
                andres::Marray<int> m(shapem.begin(), shapem.end(), scalar_);
                int* m_address = &m(0);
                m = v;
                
                test(&m(0) == m_address
                );
                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int i = 0; i < 24; ++i)
                    test(v(i)==m(i));
            }
        }
    }
    // 2D
    {
        // from a Marray
        {
            // empty
            {
                andres::Marray<int> m;
                std::vector<std::size_t> shapen(2);
                shapen[0] = 4;
                shapen[1] = 6;
                andres::Marray<int> n(shapen.begin(), shapen.end(), scalar_);
                n = m;
            }
            // 2D
            {
                int scalar = 2;
                std::vector<std::size_t> shape(2);
                shape[0] = 6; 
                shape[1] = 4;
                andres::Marray<int> m(shape.begin(), shape.end(), scalar);
                std::vector<std::size_t> shapen(2);
                shapen[0] = 6;
                shapen[1] = 4;
                andres::Marray<int> n(shapen.begin(), shapen.end(), scalar_);
                int* n_address = &n(0);
                n = m;
                
                test(&n(0) == n_address);
                test(m.size()==n.size() && m.dimension()==n.dimension());
                for(int x = 0; x < 6; ++x){
                    for(int y = 0; y < 4; ++y)
                        test(m(x, y)==n(x, y));
                }
            }
        }
        // from a view
        {
            // empty
            {
                andres::View<int, constTarget> v;
                std::vector<std::size_t> shapen(2);
                shapen[0] = 4;
                shapen[1] = 6;
                andres::Marray<int> m(shapen.begin(), shapen.end(), scalar_);
                m = v;
            }
            // 2D
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6; 
                shape[1] = 4;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                std::vector<std::size_t> shapen(2);
                shapen[0] = 6;
                shapen[1] = 4;
                andres::Marray<int> m(shapen.begin(), shapen.end(), scalar_);
                int* m_address = &m(0);
                m = v;
                
                test(&m(0) == m_address);
                test(v.size()==m.size() && v.dimension()==m.dimension());
                for(int x = 0; x < 6; ++x){
                    for(int y = 0; y < 4; ++y)
                        test(v(x, y)==m(x, y));
                }
            }
        }
    }
    // 3D
    {
        // from a Marray
        {
            // empty
            {
                andres::Marray<int> m;
                std::vector<std::size_t> shapen(3);
                shapen[0] = 2;
                shapen[1] = 3;
                shapen[2] = 4;
                andres::Marray<int> n(shapen.begin(), shapen.end(), scalar_);
                n = m;
            }
            // 3D 
            {
                int scalar = 2;
                std::vector<std::size_t> shape(3); 
                shape[0] = 3;
                shape[1] = 4; 
                shape[2] = 2; 
                andres::Marray<int> m(shape.begin(), shape.end(), scalar);
                std::vector<std::size_t> shapen(3);
                shapen[0] = 3;
                shapen[1] = 4;
                shapen[2] = 2;
                andres::Marray<int> n(shapen.begin(), shapen.end(), scalar_);
                int* n_address = &n(0);
                n = m;
                
                test(&n(0) == n_address);
                test(m.size()==n.size() && m.dimension()==n.dimension());
                for(int x = 0; x < 3; ++x){
                    for(int y = 0; y < 4; ++y){
                        for(int z = 0; z < 2; ++z)
                            test(m(x, y, z)==n(x, y, z));
                    }
                }
            }
        }
        // from a view
        {
            // empty
            {
                andres::View<int, constTarget> v;
                std::vector<std::size_t> shapen(3);
                shapen[0] = 2;
                shapen[1] = 3;
                shapen[2] = 4;
                andres::Marray<int> m(shapen.begin(), shapen.end(), scalar_);
                m = v;
            }
            // 3D
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4; 
                shape[2] = 2; 
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                std::vector<std::size_t> shapen(3);
                shapen[0] = 3;
                shapen[1] = 4;
                shapen[2] = 2;
                andres::Marray<int> m(shapen.begin(), shapen.end(), scalar_);
                int* m_address = &m(0);
                m = v;
                
                test(&m(0) == m_address
                );
                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int x = 0; x < 3; ++x){
                    for(int y = 0; y < 4; ++y){
                        for(int z = 0; z < 2; ++z)
                            test(v(x, y, z)==m(x, y, z));
                    }
                }
            }
        }
    }
}